

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_info.cc
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *this;
  size_type this_00;
  pointer this_01;
  char cVar2;
  byte bVar3;
  int iVar4;
  undefined4 uVar5;
  int iVar6;
  ostream *poVar7;
  long *plVar8;
  string *psVar9;
  undefined1 *extraout_RAX;
  undefined1 *extraout_RAX_00;
  undefined1 *puVar10;
  int *piVar11;
  element_type *peVar12;
  long lVar13;
  int64_t iVar14;
  size_t sVar15;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  int iVar16;
  pointer pwVar17;
  long lVar18;
  char **ppcVar19;
  long lVar20;
  char *pcVar21;
  Interface *this_02;
  __native_type *this_03;
  ulong uVar22;
  undefined8 uVar23;
  bool bVar24;
  shared_ptr<rcg::Device> sVar25;
  undefined1 auVar26 [12];
  string devid;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_> interf;
  vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_> system;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> device;
  shared_ptr<rcg::Device> dev;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> device_1;
  string key;
  undefined1 local_1b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Alloc_hider local_188;
  undefined8 local_170;
  __native_type local_168;
  element_type *local_140;
  string local_138;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
  local_118;
  pointer local_100;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> local_f8;
  undefined4 local_d8;
  allocator local_d2;
  allocator local_d1;
  ulong local_d0;
  int local_c4;
  ulong local_c0;
  int local_b4;
  undefined1 local_b0 [32];
  __pthread_internal_list *local_90 [2];
  __pthread_internal_list local_80;
  weak_ptr<rcg::Stream> *local_70 [2];
  weak_ptr<rcg::Stream> local_60;
  string local_50;
  
  if (argc < 2) {
    bVar24 = false;
  }
  else {
    std::__cxx11::string::string((string *)local_70,argv[1],&local_d1);
    iVar4 = std::__cxx11::string::compare((char *)local_70);
    bVar24 = iVar4 != 0;
    if (local_70[0] != &local_60) {
      operator_delete(local_70[0]);
    }
  }
  if (!bVar24) {
    pcVar21 = *argv;
    if (pcVar21 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1343f8);
    }
    else {
      sVar15 = strlen(pcVar21);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar21,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               " -h | -L | -l | -s | ([-o <xml-output-file>|.] [-m <timeout>] [-p <file>] [-d] [-e] [<interface-id>:]<device-id>[?<node>] [@<file>] [<key>=<value>] ...)"
               ,0x98);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Provides information about GenICam transport layers, interfaces and devices.",0x4c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Options: ",9);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-h   Prints help information and exits",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "-L   List all available devices on all interfaces (extended format)",0x43);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-l   List all available devices on all interfaces",0x31);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "-s   List all available devices on all interfaces (short format)",0x40);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-o   Store XML description from specified device",0x30);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "-m   Registers for module events and waits for the given number of seconds for such events"
               ,0x5a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-d   Use local device nodemap, instead of remote nodemap",0x38
              );
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-e   Open nodemap editor instead of printing nodemap",0x34);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "-p   Store all streamable parameters to the given file, after applying all parameters"
               ,0x55);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Parameters:",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "<interface-id> Optional GenICam ID of interface for connecting to the device",0x4c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "<device-id>    GenICam device ID, serial number or user defined name of device",0x4e
              );
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "<node>         Optional name of category or parameter to be reported. \'-\' for none. Default is \'Root\'."
               ,0x66);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "@<file>        Optional file with parameters as store with parameter \'-p\'",0x49);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "<key>=<value>  Optional GenICam parameters to be changed in the given order before reporting"
               ,0x5c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    iVar4 = 1;
    std::ostream::flush();
    goto LAB_0010bca3;
  }
  std::__cxx11::string::string((string *)local_1b8,argv[1],(allocator *)&local_168.__data);
  iVar4 = std::__cxx11::string::compare(local_1b8);
  if (iVar4 == 0) {
    bVar24 = true;
  }
  else {
    std::__cxx11::string::string((string *)local_90,argv[1],&local_d2);
    iVar4 = std::__cxx11::string::compare((char *)local_90);
    bVar24 = iVar4 == 0;
    if (local_90[0] != &local_80) {
      operator_delete(local_90[0]);
    }
  }
  if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
  }
  if (bVar24) {
    std::__cxx11::string::string((string *)local_1b8,argv[1],(allocator *)&local_168.__data);
    pcVar21 = "-L";
    uVar5 = std::__cxx11::string::compare(local_1b8);
    local_140 = (element_type *)CONCAT44(local_140._4_4_,uVar5);
    if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
    }
    rcg::System::getSystems();
    if (local_168._8_8_ != local_168.__align) {
      pwVar17 = (pointer)0x0;
      uVar23 = extraout_RDX;
      do {
        local_170 = (long)pwVar17 * 0x10;
        rcg::System::open(*(System **)(local_170 + local_168.__align),pcVar21,(int)uVar23);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Transport Layer ",0x10);
        rcg::System::getID_abi_cxx11_
                  ((string *)local_1b8,*(System **)(local_168.__align + local_170));
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)CONCAT71(local_1b8._1_7_,local_1b8[0]),
                            local_1b8._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
          operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Vendor:         ",0x10);
        rcg::System::getVendor_abi_cxx11_
                  ((string *)local_1b8,*(System **)(local_168.__align + local_170));
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)CONCAT71(local_1b8._1_7_,local_1b8[0]),
                            local_1b8._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
          operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Model:          ",0x10);
        rcg::System::getModel_abi_cxx11_
                  ((string *)local_1b8,*(System **)(local_168.__align + local_170));
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)CONCAT71(local_1b8._1_7_,local_1b8[0]),
                            local_1b8._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
          operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Vendor version: ",0x10);
        rcg::System::getVersion_abi_cxx11_
                  ((string *)local_1b8,*(System **)(local_168.__align + local_170));
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)CONCAT71(local_1b8._1_7_,local_1b8[0]),
                            local_1b8._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
          operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"TL type:        ",0x10);
        rcg::System::getTLType_abi_cxx11_
                  ((string *)local_1b8,*(System **)(local_168.__align + local_170));
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)CONCAT71(local_1b8._1_7_,local_1b8[0]),
                            local_1b8._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
          operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Name:           ",0x10);
        rcg::System::getName_abi_cxx11_
                  ((string *)local_1b8,*(System **)(local_168.__align + local_170));
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)CONCAT71(local_1b8._1_7_,local_1b8[0]),
                            local_1b8._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
          operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Pathname:       ",0x10);
        rcg::System::getPathname_abi_cxx11_
                  ((string *)local_1b8,*(System **)(local_168.__align + local_170));
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)CONCAT71(local_1b8._1_7_,local_1b8[0]),
                            local_1b8._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
          operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Display name:   ",0x10);
        rcg::System::getDisplayName_abi_cxx11_
                  ((string *)local_1b8,*(System **)(local_168.__align + local_170));
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)CONCAT71(local_1b8._1_7_,local_1b8[0]),
                            local_1b8._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
          operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"GenTL version   ",0x10);
        iVar4 = rcg::System::getMajorVersion(*(System **)(local_168.__align + local_170));
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,".",1);
        iVar4 = rcg::System::getMinorVersion(*(System **)(local_168.__align + local_170));
        plVar8 = (long *)std::ostream::operator<<((ostream *)poVar7,iVar4);
        std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
        std::ostream::put((char)plVar8);
        std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
        pcVar21 = *(char **)(local_168.__align + local_170);
        rcg::System::getInterfaces
                  ((vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                    *)(local_1b8 + 0x20),(System *)pcVar21);
        uVar23 = extraout_RDX_00;
        if ((int)local_140 == 0) {
          rcg::System::getNodeMap((System *)local_1b8);
          rcg::printNodemap((shared_ptr<GenApi_3_4::CNodeMapRef> *)local_1b8,"Root",100,true);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
          }
          cVar2 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
          pcVar21 = (char *)(ulong)(uint)(int)cVar2;
          std::ostream::put(-8);
          std::ostream::flush();
          uVar23 = extraout_RDX_01;
        }
        local_100 = pwVar17;
        if (local_198._8_8_ != local_198._M_allocated_capacity) {
          ppcVar19 = (char **)0x0;
          do {
            lVar18 = (long)ppcVar19 * 0x10;
            local_168.__data.__list.__next = (__pthread_internal_list *)ppcVar19;
            rcg::Interface::open
                      ((Interface *)
                       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_198._M_allocated_capacity + lVar18))->_M_allocated_capacity,
                       pcVar21,(int)uVar23);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"    Interface     ",0x12);
            psVar9 = rcg::Interface::getID_abi_cxx11_
                               ((Interface *)
                                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)(local_198._M_allocated_capacity + lVar18))->
                                _M_allocated_capacity);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(psVar9->_M_dataplus)._M_p,
                                psVar9->_M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"    Display name: ",0x12);
            rcg::Interface::getDisplayName_abi_cxx11_
                      ((string *)local_1b8,
                       (Interface *)
                       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_198._M_allocated_capacity + lVar18))->_M_allocated_capacity);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)CONCAT71(local_1b8._1_7_,local_1b8[0])
                                ,local_1b8._8_8_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
              operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"    TL type:      ",0x12);
            rcg::Interface::getTLType_abi_cxx11_
                      ((string *)local_1b8,
                       (Interface *)
                       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_198._M_allocated_capacity + lVar18))->_M_allocated_capacity);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)CONCAT71(local_1b8._1_7_,local_1b8[0])
                                ,local_1b8._8_8_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
              operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
            }
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
            std::ostream::put(-8);
            std::ostream::flush();
            pcVar21 = (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)(local_198._M_allocated_capacity + lVar18))->_M_allocated_capacity
            ;
            rcg::Interface::getDevices
                      ((vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                        *)&local_138,(Interface *)pcVar21);
            if ((int)local_140 == 0) {
              rcg::Interface::getNodeMap((Interface *)local_1b8);
              rcg::printNodemap((shared_ptr<GenApi_3_4::CNodeMapRef> *)local_1b8,"Root",100,true);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
              }
              cVar2 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
              pcVar21 = (char *)(ulong)(uint)(int)cVar2;
              std::ostream::put(-8);
              std::ostream::flush();
            }
            if ((pointer)local_138._M_string_length != local_138._M_dataplus._M_p) {
              lVar20 = 0;
              uVar22 = 0;
              do {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"        Device             ",0x1b);
                psVar9 = rcg::Device::getID_abi_cxx11_
                                   (*(Device **)(local_138._M_dataplus._M_p + lVar20));
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(psVar9->_M_dataplus)._M_p,
                                    psVar9->_M_string_length);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                std::ostream::put((char)poVar7);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"        Vendor:            ",0x1b);
                rcg::Device::getVendor_abi_cxx11_
                          ((string *)local_1b8,*(Device **)(local_138._M_dataplus._M_p + lVar20));
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,
                                    (char *)CONCAT71(local_1b8._1_7_,local_1b8[0]),local_1b8._8_8_);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                std::ostream::put((char)poVar7);
                std::ostream::flush();
                if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
                  operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"        Model:             ",0x1b);
                rcg::Device::getModel_abi_cxx11_
                          ((string *)local_1b8,*(Device **)(local_138._M_dataplus._M_p + lVar20));
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,
                                    (char *)CONCAT71(local_1b8._1_7_,local_1b8[0]),local_1b8._8_8_);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                std::ostream::put((char)poVar7);
                std::ostream::flush();
                if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
                  operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"        TL type:           ",0x1b);
                rcg::Device::getTLType_abi_cxx11_
                          ((string *)local_1b8,*(Device **)(local_138._M_dataplus._M_p + lVar20));
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,
                                    (char *)CONCAT71(local_1b8._1_7_,local_1b8[0]),local_1b8._8_8_);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                std::ostream::put((char)poVar7);
                std::ostream::flush();
                if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
                  operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"        Display name:      ",0x1b);
                rcg::Device::getDisplayName_abi_cxx11_
                          ((string *)local_1b8,*(Device **)(local_138._M_dataplus._M_p + lVar20));
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,
                                    (char *)CONCAT71(local_1b8._1_7_,local_1b8[0]),local_1b8._8_8_);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                std::ostream::put((char)poVar7);
                std::ostream::flush();
                if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
                  operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"        User defined name: ",0x1b);
                rcg::Device::getUserDefinedName_abi_cxx11_
                          ((string *)local_1b8,*(Device **)(local_138._M_dataplus._M_p + lVar20));
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,
                                    (char *)CONCAT71(local_1b8._1_7_,local_1b8[0]),local_1b8._8_8_);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                std::ostream::put((char)poVar7);
                std::ostream::flush();
                if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
                  operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"        Access status:     ",0x1b);
                rcg::Device::getAccessStatus_abi_cxx11_
                          ((string *)local_1b8,*(Device **)(local_138._M_dataplus._M_p + lVar20));
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,
                                    (char *)CONCAT71(local_1b8._1_7_,local_1b8[0]),local_1b8._8_8_);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                std::ostream::put((char)poVar7);
                std::ostream::flush();
                if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
                  operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"        Serial number:     ",0x1b);
                rcg::Device::getSerialNumber_abi_cxx11_
                          ((string *)local_1b8,*(Device **)(local_138._M_dataplus._M_p + lVar20));
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,
                                    (char *)CONCAT71(local_1b8._1_7_,local_1b8[0]),local_1b8._8_8_);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                std::ostream::put((char)poVar7);
                std::ostream::flush();
                if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
                  operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"        Version:           ",0x1b);
                rcg::Device::getVersion_abi_cxx11_
                          ((string *)local_1b8,*(Device **)(local_138._M_dataplus._M_p + lVar20));
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,
                                    (char *)CONCAT71(local_1b8._1_7_,local_1b8[0]),local_1b8._8_8_);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                std::ostream::put((char)poVar7);
                std::ostream::flush();
                if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
                  operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"        TS Frequency:      ",0x1b);
                rcg::Device::getTimestampFrequency
                          (*(Device **)(local_138._M_dataplus._M_p + lVar20));
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                std::ostream::put((char)poVar7);
                std::ostream::flush();
                cVar2 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
                pcVar21 = (char *)(ulong)(uint)(int)cVar2;
                std::ostream::put(-8);
                std::ostream::flush();
                uVar22 = uVar22 + 1;
                lVar20 = lVar20 + 0x10;
              } while (uVar22 < (ulong)((long)(local_138._M_string_length -
                                              (long)local_138._M_dataplus._M_p) >> 4));
            }
            rcg::Interface::close
                      ((Interface *)
                       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_198._M_allocated_capacity + lVar18))->_M_allocated_capacity,
                       (int)pcVar21);
            std::
            vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
            ~vector((vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                     *)&local_138);
            ppcVar19 = (char **)(local_168._32_8_ + 1);
            uVar23 = extraout_RDX_02;
          } while (ppcVar19 < (char **)((long)(local_198._8_8_ - local_198._0_8_) >> 4));
        }
        rcg::System::close(*(System **)(local_168.__align + local_170),(int)pcVar21);
        pwVar17 = local_100;
        std::
        vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>::
        ~vector((vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                 *)(local_1b8 + 0x20));
        pwVar17 = (pointer)((long)&(pwVar17->
                                   super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           + 1);
        uVar23 = extraout_RDX_03;
      } while (pwVar17 < (pointer)((long)(local_168._8_8_ - local_168._0_8_) >> 4));
    }
    this_03 = &local_168;
  }
  else {
    std::__cxx11::string::string((string *)local_1b8,argv[1],(allocator *)&local_168.__data);
    iVar4 = std::__cxx11::string::compare(local_1b8);
    if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
    }
    if (iVar4 != 0) {
      iVar4 = 2;
      local_140 = (element_type *)0xffffffff;
      iVar16 = 1;
      bVar3 = 2 < argc;
      if ((argc < 3) || (pcVar21 = argv[1], *pcVar21 != '-')) {
        local_168._32_8_ = 0;
        local_170 = (char *)0x0;
        local_d0 = 0;
        local_100 = (pointer)0x0;
      }
      else {
        ppcVar19 = argv + 1;
        local_140 = (element_type *)0xffffffff;
        iVar16 = 1;
        local_168._32_8_ = 0;
        local_170 = (char *)0x0;
        local_d0 = 0;
        local_100 = (pointer)0x0;
        do {
          std::__cxx11::string::string((string *)local_1b8,pcVar21,(allocator *)&local_168.__data);
          iVar6 = std::__cxx11::string::compare(local_1b8);
          if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
            operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
          }
          if (iVar6 == 0) {
            ppcVar19 = (char **)argv[iVar4];
            std::__cxx11::string::string
                      ((string *)local_1b8,(char *)ppcVar19,(allocator *)&local_168.__data);
            iVar4 = std::__cxx11::string::compare(local_1b8);
            if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
              operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
            }
            iVar16 = iVar16 + 2;
            local_168.__data.__list.__next = (__pthread_internal_list *)ppcVar19;
            if (iVar4 == 0) {
              local_168.__data.__list.__next = (__pthread_internal_list *)"";
            }
          }
          else {
            std::__cxx11::string::string
                      ((string *)local_1b8,*ppcVar19,(allocator *)&local_168.__data);
            iVar6 = std::__cxx11::string::compare(local_1b8);
            if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
              operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
            }
            if (iVar6 == 0) {
              std::__cxx11::string::string
                        ((string *)local_1b8,argv[iVar4],(allocator *)(local_1b8 + 0x20));
              pcVar21 = (char *)CONCAT71(local_1b8._1_7_,local_1b8[0]);
              piVar11 = __errno_location();
              iVar4 = *piVar11;
              *piVar11 = 0;
              peVar12 = (element_type *)strtol(pcVar21,(char **)&local_168.__align,10);
              if ((char *)local_168.__align != pcVar21) {
                local_140 = peVar12;
                if (((element_type *)(long)(int)peVar12 == peVar12) && (*piVar11 != 0x22)) {
                  if (*piVar11 == 0) {
                    *piVar11 = iVar4;
                  }
                  if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
                    operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
                  }
                  iVar16 = iVar16 + 2;
                  goto LAB_0010a6d6;
                }
                std::__throw_out_of_range("stoi");
              }
              auVar26 = std::__throw_invalid_argument("stoi");
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8.
                     super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_f8.
                           super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
              }
              if ((Device *)
                  local_118.
                  super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish != (Device *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_118.
                           super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
              }
              if ((int *)local_168.__align != &local_168.__data.__kind) {
                operator_delete((void *)local_168.__align);
              }
              if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
                operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
              }
              if (auVar26._8_4_ != 1) {
                _Unwind_Resume(auVar26._0_8_);
              }
              plVar8 = (long *)__cxa_begin_catch(auVar26._0_8_);
              pcVar21 = (char *)(**(code **)(*plVar8 + 0x10))(plVar8);
              if (pcVar21 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x134678);
              }
              else {
                sVar15 = strlen(pcVar21);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,pcVar21,sVar15);
              }
              std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
              std::ostream::put('x');
              std::ostream::flush();
              __cxa_end_catch();
              iVar4 = 2;
              goto LAB_0010bca3;
            }
            std::__cxx11::string::string
                      ((string *)local_1b8,*ppcVar19,(allocator *)&local_168.__data);
            iVar6 = std::__cxx11::string::compare(local_1b8);
            if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
              operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
            }
            if (iVar6 == 0) {
              iVar16 = iVar16 + 2;
              local_170 = argv[iVar4];
            }
            else {
              std::__cxx11::string::string
                        ((string *)local_1b8,*ppcVar19,(allocator *)&local_168.__data);
              iVar6 = std::__cxx11::string::compare(local_1b8);
              puVar10 = local_1b8 + 0x10;
              if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != puVar10) {
                operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
                puVar10 = extraout_RAX;
              }
              iVar16 = iVar4;
              if (iVar6 == 0) {
                local_d0 = CONCAT71((int7)((ulong)puVar10 >> 8),1);
              }
              else {
                std::__cxx11::string::string
                          ((string *)local_1b8,*ppcVar19,(allocator *)&local_168.__data);
                iVar4 = std::__cxx11::string::compare(local_1b8);
                puVar10 = local_1b8 + 0x10;
                if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != puVar10) {
                  operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
                  puVar10 = extraout_RAX_00;
                }
                local_100 = (pointer)CONCAT71((int7)((ulong)puVar10 >> 8),1);
                if (iVar4 != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Unknown parameter: ",0x13);
                  poVar7 = std::operator<<((ostream *)&std::cerr,*ppcVar19);
                  iVar4 = 1;
                  std::endl<char,std::char_traits<char>>(poVar7);
                  goto LAB_0010bca3;
                }
              }
            }
          }
LAB_0010a6d6:
          iVar4 = iVar16 + 1;
          if (argc <= iVar4) break;
          ppcVar19 = argv + iVar16;
          pcVar21 = *ppcVar19;
        } while (*pcVar21 == '-');
        bVar3 = iVar4 < argc | (byte)local_100;
      }
      if (argc <= iVar16) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Device name not given!",0x16);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
        std::ostream::put('x');
        iVar4 = 1;
        std::ostream::flush();
        goto LAB_0010bca3;
      }
      local_c0 = CONCAT71(local_c0._1_7_,bVar3);
      local_b4 = iVar4;
      std::__cxx11::string::string((string *)local_1b8,argv[iVar16],(allocator *)&local_168.__data);
      local_168.__align = (long)&local_168.__data.__kind;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Root","");
      lVar18 = std::__cxx11::string::find((char)local_1b8,0x3f);
      local_c4 = 1000;
      local_d8 = (undefined4)CONCAT71((int7)((ulong)lVar18 >> 8),1);
      if (lVar18 != -1) {
        std::__cxx11::string::substr((ulong)(local_1b8 + 0x20),(ulong)local_1b8);
        iVar4 = std::__cxx11::string::compare(local_1b8 + 0x20);
        paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_1b8 + 0x30);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_allocated_capacity != paVar1) {
          operator_delete((void *)local_198._M_allocated_capacity);
        }
        if (iVar4 == 0) {
          std::__cxx11::string::operator=((string *)&local_168.__data,"");
          std::__cxx11::string::substr((ulong)(local_1b8 + 0x20),(ulong)local_1b8);
          std::__cxx11::string::operator=((string *)local_1b8,(string *)(local_1b8 + 0x20));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_allocated_capacity != paVar1) {
            operator_delete((void *)local_198._M_allocated_capacity);
          }
        }
        else {
          std::__cxx11::string::substr((ulong)(local_1b8 + 0x20),(ulong)local_1b8);
          std::__cxx11::string::operator=((string *)&local_168.__data,(string *)(local_1b8 + 0x20));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_allocated_capacity != paVar1) {
            operator_delete((void *)local_198._M_allocated_capacity);
          }
          std::__cxx11::string::substr((ulong)(local_1b8 + 0x20),(ulong)local_1b8);
          std::__cxx11::string::operator=((string *)local_1b8,(string *)(local_1b8 + 0x20));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_allocated_capacity != paVar1) {
            operator_delete((void *)local_198._M_allocated_capacity);
          }
          local_c4 = 1;
          if ((__pthread_internal_list *)local_168._8_8_ == (__pthread_internal_list *)0x0) {
            std::__cxx11::string::operator=((string *)&local_168.__data,"Root");
          }
          local_d8 = 0;
        }
      }
      sVar25 = rcg::getDevice((rcg *)&local_118,(char *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
      if ((Device *)
          local_118.
          super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
          ._M_impl.super__Vector_impl_data._M_start == (Device *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Device \'",8);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)CONCAT71(local_1b8._1_7_,local_1b8[0]),
                            local_1b8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\' not found!",0xc);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        iVar4 = 1;
        std::ostream::flush();
      }
      else {
        rcg::Device::open((Device *)
                          local_118.
                          super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (char *)(ulong)(((byte)local_c0 | (char *)local_170 != (char *)0x0) & 1),
                          (int)sVar25.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
        local_f8.
        super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_f8.
        super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if ((local_d0 & 1) == 0) {
          rcg::Device::getRemoteNodeMap
                    ((Device *)(local_1b8 + 0x20),
                     (char *)local_118.
                             super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
        }
        else {
          rcg::Device::getNodeMap
                    ((Device *)(local_1b8 + 0x20),
                     (char *)local_118.
                             super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
        }
        this_01 = local_f8.
                  super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        local_f8.
        super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_198._8_8_;
        local_f8.
        super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_198._M_allocated_capacity;
        local_198._M_allocated_capacity = 0;
        local_198._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._8_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
        }
        if (-1 < (int)local_140) {
          rcg::Device::enableModuleEvents
                    ((Device *)
                     local_118.
                     super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          local_138._M_dataplus._M_p = (pointer)0x0;
          local_138._M_string_length = 0;
          rcg::Device::getNodeMap
                    ((Device *)(local_1b8 + 0x20),
                     (char *)local_118.
                             super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          this_00 = local_138._M_string_length;
          local_138._M_string_length = local_198._8_8_;
          local_138._M_dataplus._M_p = (pointer)local_198._M_allocated_capacity;
          local_198._M_allocated_capacity = 0;
          local_198._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if ((element_type *)this_00 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
          }
          local_198._M_allocated_capacity = 0;
          local_198._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_188._M_p = (pointer)0x0;
          local_168.__data.__list.__next = (__pthread_internal_list *)argv;
          rcg::getEnum(&local_50,(shared_ptr<GenApi_3_4::CNodeMapRef> *)&local_138,"EventSelector",
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(local_1b8 + 0x20),false);
          local_c0 = (ulong)(uint)argc;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if (local_198._8_8_ != local_198._M_allocated_capacity) {
            lVar18 = 0;
            uVar22 = 0;
            do {
              rcg::setEnum((shared_ptr<GenApi_3_4::CNodeMapRef> *)&local_138,"EventSelector",
                           *(char **)(local_198._M_allocated_capacity + lVar18),true);
              rcg::setEnum((shared_ptr<GenApi_3_4::CNodeMapRef> *)&local_138,"EventNotification",
                           "On",false);
              uVar22 = uVar22 + 1;
              lVar18 = lVar18 + 0x20;
            } while (uVar22 < (ulong)((long)(local_198._8_8_ - local_198._0_8_) >> 5));
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_1b8 + 0x20));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_string_length !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length);
          }
          argc = (int)local_c0;
          argv = (char **)local_168._32_8_;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.
               super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          pcVar21 = "Nodemap not available!";
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Nodemap not available!",0x16);
          iVar4 = 0;
          std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        }
        else {
          iVar4 = argc - local_b4;
          if (local_b4 < argc) {
            lVar18 = (long)local_b4;
            lVar20 = 0;
            this = (string *)(local_1b8 + 0x20);
            do {
              std::__cxx11::string::string(this,argv[lVar18 + lVar20],(allocator *)&local_138);
              if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_198._8_8_ ==
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0) || (*(char *)local_198._M_allocated_capacity != '@')) {
                lVar13 = std::__cxx11::string::find((char)this,0x3d);
                if (lVar13 != -1) {
                  std::__cxx11::string::find((char)this,0x3d);
                  std::__cxx11::string::substr((ulong)&local_138,(ulong)this);
                  std::__cxx11::string::substr((ulong)local_b0,(ulong)this);
                  rcg::setString((shared_ptr<GenApi_3_4::CNodeMapRef> *)&local_f8,
                                 (char *)local_b0._0_8_,local_138._M_dataplus._M_p,true);
                  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
                    operator_delete((void *)local_b0._0_8_);
                  }
                  goto LAB_0010b07d;
                }
                rcg::callCommand((shared_ptr<GenApi_3_4::CNodeMapRef> *)&local_f8,
                                 (char *)local_198._M_allocated_capacity,true);
              }
              else {
                std::__cxx11::string::substr((ulong)&local_138,(ulong)this);
                rcg::loadStreamableParameters
                          ((shared_ptr<GenApi_3_4::CNodeMapRef> *)&local_f8,
                           local_138._M_dataplus._M_p,true);
LAB_0010b07d:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p != &local_138.field_2) {
                  operator_delete(local_138._M_dataplus._M_p);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_allocated_capacity !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_1b8 + 0x30)) {
                operator_delete((void *)local_198._M_allocated_capacity);
              }
              lVar20 = lVar20 + 1;
            } while (iVar4 != (int)lVar20);
          }
          if (-1 < (int)local_140) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Waiting for events",0x12);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            iVar14 = rcg::Device::getModuleEvent
                               ((Device *)
                                local_118.
                                super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)(uint)((int)local_140 * 1000));
            if (iVar14 < 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Received no module events",0x19);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            }
            while (-1 < iVar14) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Received module event with ID: ",0x1f);
              poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              iVar14 = rcg::Device::getModuleEvent
                                 ((Device *)
                                  local_118.
                                  super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,0);
            }
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
          if (((ulong)local_100 & 1) == 0) {
            iVar4 = 0;
            if ((__pthread_internal_list *)local_168._8_8_ != (__pthread_internal_list *)0x0) {
              if ((char)local_d8 == '\0') {
                bVar24 = rcg::printNodemap((shared_ptr<GenApi_3_4::CNodeMapRef> *)&local_f8,
                                           (char *)local_168.__align,1,true);
                if (!bVar24) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Unknown node: ",0xe);
                  goto LAB_0010b6ab;
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Device:            ",0x13);
                psVar9 = rcg::Device::getID_abi_cxx11_
                                   ((Device *)
                                    local_118.
                                    super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(psVar9->_M_dataplus)._M_p,
                                    psVar9->_M_string_length);
                std::endl<char,std::char_traits<char>>(poVar7);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Vendor:            ",0x13);
                rcg::Device::getVendor_abi_cxx11_
                          ((string *)(local_1b8 + 0x20),
                           (Device *)
                           local_118.
                           super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(char *)local_198._M_allocated_capacity,
                                    local_198._8_8_);
                std::endl<char,std::char_traits<char>>(poVar7);
                paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(local_1b8 + 0x30);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._M_allocated_capacity != paVar1) {
                  operator_delete((void *)local_198._M_allocated_capacity);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Model:             ",0x13);
                rcg::Device::getModel_abi_cxx11_
                          ((string *)(local_1b8 + 0x20),
                           (Device *)
                           local_118.
                           super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(char *)local_198._M_allocated_capacity,
                                    local_198._8_8_);
                std::endl<char,std::char_traits<char>>(poVar7);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._M_allocated_capacity != paVar1) {
                  operator_delete((void *)local_198._M_allocated_capacity);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"TL type:           ",0x13);
                rcg::Device::getTLType_abi_cxx11_
                          ((string *)(local_1b8 + 0x20),
                           (Device *)
                           local_118.
                           super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(char *)local_198._M_allocated_capacity,
                                    local_198._8_8_);
                std::endl<char,std::char_traits<char>>(poVar7);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._M_allocated_capacity != paVar1) {
                  operator_delete((void *)local_198._M_allocated_capacity);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Display name:      ",0x13);
                rcg::Device::getDisplayName_abi_cxx11_
                          ((string *)(local_1b8 + 0x20),
                           (Device *)
                           local_118.
                           super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(char *)local_198._M_allocated_capacity,
                                    local_198._8_8_);
                std::endl<char,std::char_traits<char>>(poVar7);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._M_allocated_capacity != paVar1) {
                  operator_delete((void *)local_198._M_allocated_capacity);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"User defined name: ",0x13);
                rcg::Device::getUserDefinedName_abi_cxx11_
                          ((string *)(local_1b8 + 0x20),
                           (Device *)
                           local_118.
                           super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(char *)local_198._M_allocated_capacity,
                                    local_198._8_8_);
                std::endl<char,std::char_traits<char>>(poVar7);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._M_allocated_capacity != paVar1) {
                  operator_delete((void *)local_198._M_allocated_capacity);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Serial number:     ",0x13);
                rcg::Device::getSerialNumber_abi_cxx11_
                          ((string *)(local_1b8 + 0x20),
                           (Device *)
                           local_118.
                           super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(char *)local_198._M_allocated_capacity,
                                    local_198._8_8_);
                std::endl<char,std::char_traits<char>>(poVar7);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._M_allocated_capacity != paVar1) {
                  operator_delete((void *)local_198._M_allocated_capacity);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Version:           ",0x13);
                rcg::Device::getVersion_abi_cxx11_
                          ((string *)(local_1b8 + 0x20),
                           (Device *)
                           local_118.
                           super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(char *)local_198._M_allocated_capacity,
                                    local_198._8_8_);
                std::endl<char,std::char_traits<char>>(poVar7);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._M_allocated_capacity != paVar1) {
                  operator_delete((void *)local_198._M_allocated_capacity);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"TS Frequency:      ",0x13);
                rcg::Device::getTimestampFrequency
                          ((Device *)
                           local_118.
                           super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::endl<char,std::char_traits<char>>(poVar7);
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                rcg::Device::getStreams
                          ((vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                            *)(local_1b8 + 0x20),
                           (Device *)
                           local_118.
                           super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Available streams:",0x12);
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                if (local_198._8_8_ != local_198._M_allocated_capacity) {
                  lVar18 = 0;
                  uVar22 = 0;
                  do {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"  Stream ID: ",0xd);
                    psVar9 = rcg::Stream::getID_abi_cxx11_
                                       (*(Stream **)(local_198._M_allocated_capacity + lVar18));
                    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,(psVar9->_M_dataplus)._M_p,
                                        psVar9->_M_string_length);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                    std::ostream::put((char)poVar7);
                    std::ostream::flush();
                    uVar22 = uVar22 + 1;
                    lVar18 = lVar18 + 0x10;
                  } while (uVar22 < (ulong)((long)(local_198._8_8_ - local_198._0_8_) >> 4));
                }
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                pcVar21 = "Remote device nodemap:";
                if ((local_d0 & 1) != 0) {
                  pcVar21 = "Local device nodemap:";
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pcVar21,0x16 - (ulong)((uint)local_d0 & 1));
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                rcg::printNodemap((shared_ptr<GenApi_3_4::CNodeMapRef> *)&local_f8,
                                  (char *)local_168.__align,local_c4,true);
                std::
                vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                ::~vector((vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                           *)(local_1b8 + 0x20));
              }
            }
          }
          else {
            bVar24 = rcg::editNodemap((shared_ptr<GenApi_3_4::CNodeMapRef> *)&local_f8,
                                      (char *)local_168.__align);
            iVar4 = 0;
            if (!bVar24) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Unknown node: ",0xe);
LAB_0010b6ab:
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,(char *)local_168.__align,local_168._8_8_);
              iVar4 = 1;
              std::endl<char,std::char_traits<char>>(poVar7);
            }
          }
          pcVar21 = (char *)local_170;
          if ((char *)local_170 != (char *)0x0) {
            rcg::saveStreamableParameters
                      ((shared_ptr<GenApi_3_4::CNodeMapRef> *)&local_f8,(char *)local_170,true);
          }
        }
        rcg::Device::close((Device *)
                           local_118.
                           super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,(int)pcVar21);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.
               super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
               ._M_impl.super__Vector_impl_data._M_finish !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_f8.
                     super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
      }
      if ((Device *)
          local_118.
          super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != (Device *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_118.
                   super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      if ((int *)local_168.__align != &local_168.__data.__kind) {
        operator_delete((void *)local_168.__align);
      }
      if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
        operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
      }
      goto LAB_0010bca3;
    }
    rcg::System::getSystems();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Interface\tSerial Number\tVendor\tModel\tName",0x29);
    cVar2 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    this_02 = (Interface *)(ulong)(uint)(int)cVar2;
    std::ostream::put(-8);
    std::ostream::flush();
    if (local_b0._8_8_ != local_b0._0_8_) {
      pwVar17 = (pointer)0x0;
      uVar23 = extraout_RDX_04;
      do {
        rcg::System::open(*(System **)(local_b0._0_8_ + (long)pwVar17 * 0x10),(char *)this_02,
                          (int)uVar23);
        this_02 = *(Interface **)(local_b0._0_8_ + (long)pwVar17 * 0x10);
        local_100 = pwVar17;
        rcg::System::getInterfaces(&local_118,(System *)this_02);
        uVar23 = (char *)((long)pwVar17 * 0x10);
        if (local_118.
            super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_118.
            super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          peVar12 = (element_type *)0x0;
          local_170 = (char *)((long)pwVar17 * 0x10);
          do {
            uVar23 = (long)peVar12 * 0x10;
            local_140 = peVar12;
            rcg::Interface::open
                      ((Interface *)
                       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       (local_118.
                        super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)peVar12))->
                       _vptr__Sp_counted_base,(char *)this_02,(int)peVar12);
            this_02 = (Interface *)
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (local_118.
                       super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + (long)peVar12))->
                      _vptr__Sp_counted_base;
            rcg::Interface::getDevices(&local_f8,this_02);
            if (local_f8.
                super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_f8.
                super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              lVar18 = 0;
              uVar22 = 0;
              local_168.__data.__list.__next = (__pthread_internal_list *)uVar23;
              do {
                psVar9 = rcg::Interface::getID_abi_cxx11_
                                   (*(Interface **)
                                     ((long)&(((enable_shared_from_this<rcg::Device> *)
                                              &(local_118.
                                                super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                               super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>
                                              )->_M_weak_this).
                                             super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + uVar23));
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(psVar9->_M_dataplus)._M_p,
                                    psVar9->_M_string_length);
                local_1b8[0] = (string)0x9;
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_1b8,1);
                rcg::Device::getSerialNumber_abi_cxx11_
                          ((string *)local_1b8,
                           *(Device **)
                            ((long)local_f8.
                                   super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar18));
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(char *)CONCAT71(local_1b8._1_7_,local_1b8[0]),
                                    local_1b8._8_8_);
                local_168.__size[0] = 9;
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,local_168.__size,1);
                rcg::Device::getVendor_abi_cxx11_
                          ((string *)&local_168.__data,
                           *(Device **)
                            ((long)local_f8.
                                   super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar18));
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(char *)local_168.__align,local_168._8_8_);
                local_198._M_local_buf[0] = 9;
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(char *)(local_1b8 + 0x20),1);
                rcg::Device::getModel_abi_cxx11_
                          ((string *)(local_1b8 + 0x20),
                           *(Device **)
                            ((long)local_f8.
                                   super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar18));
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(char *)local_198._M_allocated_capacity,local_198._8_8_);
                local_138._M_dataplus._M_p._0_1_ = 9;
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(char *)&local_138,1);
                rcg::Device::getDisplayName_abi_cxx11_
                          (&local_138,
                           *(Device **)
                            ((long)local_f8.
                                   super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar18));
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,local_138._M_dataplus._M_p,local_138._M_string_length);
                cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) +
                                        (char)poVar7);
                this_02 = (Interface *)(ulong)(uint)(int)cVar2;
                std::ostream::put((char)poVar7);
                std::ostream::flush();
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p != &local_138.field_2) {
                  operator_delete(local_138._M_dataplus._M_p);
                }
                uVar23 = local_168._32_8_;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._M_allocated_capacity !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_1b8 + 0x30)) {
                  operator_delete((void *)local_198._M_allocated_capacity);
                }
                if ((int *)local_168.__align != &local_168.__data.__kind) {
                  operator_delete((void *)local_168.__align);
                }
                if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
                  operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
                }
                uVar22 = uVar22 + 1;
                lVar18 = lVar18 + 0x10;
              } while (uVar22 < (ulong)((long)local_f8.
                                              super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_f8.
                                              super__Vector_base<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 4));
            }
            rcg::Interface::close
                      (*(Interface **)
                        ((long)&(((enable_shared_from_this<rcg::Device> *)
                                 &(local_118.
                                   super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                  super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>)->
                                _M_weak_this).
                                super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                        uVar23),(int)this_02);
            std::
            vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
            ~vector(&local_f8);
            peVar12 = (element_type *)&(local_140->super_IPort).field_0x1;
            uVar23 = local_170;
          } while (peVar12 < (undefined1 *)
                             ((long)local_118.
                                    super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_118.
                                    super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4));
        }
        rcg::System::close(*(System **)(uVar23 + local_b0._0_8_),(int)this_02);
        std::
        vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>::
        ~vector(&local_118);
        pwVar17 = (pointer)((long)&(local_100->
                                   super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           + 1);
        uVar23 = extraout_RDX_05;
      } while (pwVar17 < (pointer)((long)(local_b0._8_8_ - local_b0._0_8_) >> 4));
    }
    this_03 = (__native_type *)local_b0;
  }
  std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::~vector
            ((vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_> *
             )&this_03->__data);
  iVar4 = 0;
LAB_0010bca3:
  rcg::System::clearSystems();
  return iVar4;
}

Assistant:

int main(int argc, char *argv[])
{
  int ret=0;

  try
  {
    if (argc >= 2 && std::string(argv[1]) != "-h")
    {
      if (std::string(argv[1]) == "-L" || std::string(argv[1]) == "-l")
      {
        bool extended=(std::string(argv[1]) == "-L");

        // list all systems, interfaces and devices

        std::vector<std::shared_ptr<rcg::System> > system=rcg::System::getSystems();

        for (size_t i=0; i<system.size(); i++)
        {
          system[i]->open();

          std::cout << "Transport Layer " << system[i]->getID() << std::endl;
          std::cout << "Vendor:         " << system[i]->getVendor() << std::endl;
          std::cout << "Model:          " << system[i]->getModel() << std::endl;
          std::cout << "Vendor version: " << system[i]->getVersion() << std::endl;
          std::cout << "TL type:        " << system[i]->getTLType() << std::endl;
          std::cout << "Name:           " << system[i]->getName() << std::endl;
          std::cout << "Pathname:       " << system[i]->getPathname() << std::endl;
          std::cout << "Display name:   " << system[i]->getDisplayName() << std::endl;
          std::cout << "GenTL version   " << system[i]->getMajorVersion() << "."
                    << system[i]->getMinorVersion() << std::endl;
          std::cout << std::endl;

          std::vector<std::shared_ptr<rcg::Interface> > interf=system[i]->getInterfaces();

          if (extended)
          {
            rcg::printNodemap(system[i]->getNodeMap(), "Root");
            std::cout << std::endl;
          }

          for (size_t k=0; k<interf.size(); k++)
          {
            interf[k]->open();

            std::cout << "    Interface     " << interf[k]->getID() << std::endl;
            std::cout << "    Display name: " << interf[k]->getDisplayName() << std::endl;
            std::cout << "    TL type:      " << interf[k]->getTLType() << std::endl;
            std::cout << std::endl;

            std::vector<std::shared_ptr<rcg::Device> > device=interf[k]->getDevices();

            if (extended)
            {
              rcg::printNodemap(interf[k]->getNodeMap(), "Root");
              std::cout << std::endl;
            }

            for (size_t j=0; j<device.size(); j++)
            {
              std::cout << "        Device             " << device[j]->getID() << std::endl;
              std::cout << "        Vendor:            " << device[j]->getVendor() << std::endl;
              std::cout << "        Model:             " << device[j]->getModel() << std::endl;
              std::cout << "        TL type:           " << device[j]->getTLType() << std::endl;
              std::cout << "        Display name:      " << device[j]->getDisplayName() << std::endl;
              std::cout << "        User defined name: " << device[j]->getUserDefinedName() << std::endl;
              std::cout << "        Access status:     " << device[j]->getAccessStatus() << std::endl;
              std::cout << "        Serial number:     " << device[j]->getSerialNumber() << std::endl;
              std::cout << "        Version:           " << device[j]->getVersion() << std::endl;
              std::cout << "        TS Frequency:      " << device[j]->getTimestampFrequency() << std::endl;
              std::cout << std::endl;
            }

            interf[k]->close();
          }

          system[i]->close();
        }
      }
      else if (std::string(argv[1]) == "-s")
      {
        // list all systems, interfaces and devices

        std::vector<std::shared_ptr<rcg::System> > system=rcg::System::getSystems();

        std::cout << "Interface\tSerial Number\tVendor\tModel\tName" << std::endl;

        for (size_t i=0; i<system.size(); i++)
        {
          system[i]->open();

          std::vector<std::shared_ptr<rcg::Interface> > interf=system[i]->getInterfaces();

          for (size_t k=0; k<interf.size(); k++)
          {
            interf[k]->open();

            std::vector<std::shared_ptr<rcg::Device> > device=interf[k]->getDevices();

            for (size_t j=0; j<device.size(); j++)
            {
              std::cout << interf[k]->getID() << '\t'
                        << device[j]->getSerialNumber() << '\t'
                        << device[j]->getVendor() << '\t'
                        << device[j]->getModel() << '\t'
                        << device[j]->getDisplayName() << std::endl;
            }

            interf[k]->close();
          }

          system[i]->close();
        }
      }
      else
      {
        int k=1;

        // get parameters, if any

        int module_event_timeout=-1;
        const char *xml=0;
        const char *paramfile=0;
        bool local_nodemap=false;
        bool edit=false;

        while (k+1 < argc && argv[k][0] == '-')
        {
          if (std::string(argv[k]) == "-o")
          {
            k++;
            xml=argv[k++];

            if (std::string(xml) == ".")
            {
              xml="";
            }
          }
          else if (std::string(argv[k]) == "-m")
          {
            k++;
            module_event_timeout=std::stoi(std::string(argv[k++]));
          }
          else if (std::string(argv[k]) == "-p")
          {
            k++;
            paramfile=argv[k++];
          }
          else if (std::string(argv[k]) == "-d")
          {
            k++;
            local_nodemap=true;
          }
          else if (std::string(argv[k]) == "-e")
          {
            k++;
            edit=true;
          }
          else
          {
            std::cerr << "Unknown parameter: " << argv[k] << std::endl;
            ret=1;
            break;
          }
        }

        if (ret == 0)
        {
          if (k < argc)
          {
            // separate optional node name from device id

            std::string devid=argv[k++];
            std::string node="Root";
            int depth=1000;

            {
              size_t j=devid.find('?');

              if (j != std::string::npos)
              {
                if (devid.substr(j+1) != "-")
                {
                  node=devid.substr(j+1);
                  devid=devid.substr(0, j);
                  depth=1;

                  if (node.size() == 0)
                  {
                    node="Root";
                  }
                }
                else
                {
                  node="";
                  devid=devid.substr(0, j);
                }
              }
            }

            // find specific device accross all systems and interfaces

            std::shared_ptr<rcg::Device> dev=rcg::getDevice(devid.c_str());

            if (dev)
            {
              // open device and optionally change some settings

              if (k < argc || edit || paramfile)
              {
                dev->open(rcg::Device::CONTROL);
              }
              else
              {
                dev->open(rcg::Device::READONLY);
              }

              // get nodemap

              std::shared_ptr<GenApi::CNodeMapRef> nodemap;
              if (local_nodemap)
              {
                nodemap=dev->getNodeMap(xml);
              }
              else
              {
                nodemap=dev->getRemoteNodeMap(xml);
              }

              // register and enable module events

              if (module_event_timeout >= 0)
              {
                dev->enableModuleEvents();

                std::shared_ptr<GenApi::CNodeMapRef> lnodemap;
                lnodemap=dev->getNodeMap();

                std::vector<std::string> list;
                rcg::getEnum(lnodemap, "EventSelector", list, false);

                for (size_t i=0; i<list.size(); i++)
                {
                  rcg::setEnum(lnodemap, "EventSelector", list[i].c_str(), true);
                  rcg::setEnum(lnodemap, "EventNotification", "On", false);
                }
              }

              if (nodemap)
              {
                // interpret all remaining parameters

                while (k < argc)
                {
                  std::string p=argv[k++];

                  if (p.size() > 0 && p[0] == '@')
                  {
                    // load streamable parameters from file into nodemap

                    rcg::loadStreamableParameters(nodemap, p.substr(1).c_str(), true);
                  }
                  else if (p.find('=') != std::string::npos)
                  {
                    // split argument in key and value

                    size_t j=p.find('=');
                    std::string value=p.substr(j+1);
                    std::string key=p.substr(0, j);

                    // set key=value pair through GenICam

                    rcg::setString(nodemap, key.c_str(), value.c_str(), true);
                  }
                  else
                  {
                    // call the command
                    rcg::callCommand(nodemap, p.c_str(), true);
                  }
                }

                if (module_event_timeout >= 0)
                {
                  std::cout << "Waiting for events" << std::endl;

                  int64_t eventid=dev->getModuleEvent(1000*module_event_timeout);

                  if (eventid < 0)
                  {
                    std::cout << "Received no module events" << std::endl;
                  }

                  while (eventid >= 0)
                  {
                    std::cout << "Received module event with ID: " << eventid << std::endl;
                    eventid=dev->getModuleEvent(0);
                  }

                  std::cout << std::endl;
                }

                if (edit)
                {
                  if (!rcg::editNodemap(nodemap, node.c_str()))
                  {
                    std::cerr << "Unknown node: " << node << std::endl;
                    ret=1;
                  }
                }
                else if (node.size() > 0)
                {
                  if (depth > 1)
                  {
                    // report all features

                    std::cout << "Device:            " << dev->getID() << std::endl;
                    std::cout << "Vendor:            " << dev->getVendor() << std::endl;
                    std::cout << "Model:             " << dev->getModel() << std::endl;
                    std::cout << "TL type:           " << dev->getTLType() << std::endl;
                    std::cout << "Display name:      " << dev->getDisplayName() << std::endl;
                    std::cout << "User defined name: " << dev->getUserDefinedName() << std::endl;
                    std::cout << "Serial number:     " << dev->getSerialNumber() << std::endl;
                    std::cout << "Version:           " << dev->getVersion() << std::endl;
                    std::cout << "TS Frequency:      " << dev->getTimestampFrequency() << std::endl;
                    std::cout << std::endl;

                    std::vector<std::shared_ptr<rcg::Stream> > stream=dev->getStreams();

                    std::cout << "Available streams:" << std::endl;
                    for (size_t i=0; i<stream.size(); i++)
                    {
                      std::cout << "  Stream ID: " << stream[i]->getID() << std::endl;
                    }

                    std::cout << std::endl;

                    if (local_nodemap)
                    {
                      std::cout << "Local device nodemap:" << std::endl;
                    }
                    else
                    {
                      std::cout << "Remote device nodemap:" << std::endl;
                    }

                    rcg::printNodemap(nodemap, node.c_str(), depth, true);
                  }
                  else
                  {
                    // report requested node only

                    if (!rcg::printNodemap(nodemap, node.c_str(), depth, true))
                    {
                      std::cerr << "Unknown node: " << node << std::endl;
                      ret=1;
                    }
                  }
                }

                if (paramfile)
                {
                  rcg::saveStreamableParameters(nodemap, paramfile, true);
                }
              }
              else
              {
                std::cerr << "Nodemap not available!" << std::endl;
              }

              dev->close();
            }
            else
            {
              std::cerr << "Device '" << devid << "' not found!" << std::endl;
              ret=1;
            }
          }
          else
          {
            std::cerr << "Device name not given!" << std::endl;
            ret=1;
          }
        }
      }
    }
    else
    {
      std::cout << argv[0] << " -h | -L | -l | -s | ([-o <xml-output-file>|.] [-m <timeout>] [-p <file>] [-d] [-e] [<interface-id>:]<device-id>[?<node>] [@<file>] [<key>=<value>] ...)" << std::endl;
      std::cout << std::endl;
      std::cout << "Provides information about GenICam transport layers, interfaces and devices." << std::endl;
      std::cout << std::endl;
      std::cout << "Options: " << std::endl;
      std::cout << "-h   Prints help information and exits" << std::endl;
      std::cout << "-L   List all available devices on all interfaces (extended format)" << std::endl;
      std::cout << "-l   List all available devices on all interfaces" << std::endl;
      std::cout << "-s   List all available devices on all interfaces (short format)" << std::endl;
      std::cout << "-o   Store XML description from specified device" << std::endl;
      std::cout << "-m   Registers for module events and waits for the given number of seconds for such events" << std::endl;
      std::cout << "-d   Use local device nodemap, instead of remote nodemap" << std::endl;
      std::cout << "-e   Open nodemap editor instead of printing nodemap" << std::endl;
      std::cout << "-p   Store all streamable parameters to the given file, after applying all parameters" << std::endl;
      std::cout << std::endl;
      std::cout << "Parameters:" << std::endl;
      std::cout << "<interface-id> Optional GenICam ID of interface for connecting to the device" << std::endl;
      std::cout << "<device-id>    GenICam device ID, serial number or user defined name of device" << std::endl;
      std::cout << "<node>         Optional name of category or parameter to be reported. '-' for none. Default is 'Root'." << std::endl;
      std::cout << "@<file>        Optional file with parameters as store with parameter '-p'" << std::endl;
      std::cout << "<key>=<value>  Optional GenICam parameters to be changed in the given order before reporting" << std::endl;
      ret=1;
    }
  }
  catch (const std::exception &ex)
  {
    std::cerr << ex.what() << std::endl;
    ret=2;
  }

  rcg::System::clearSystems();

  return ret;
}